

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

uint16_t dns_get_edns_udp_payload_size(char *rsp,size_t len)

{
  ushort uVar1;
  char *pcVar2;
  
  pcVar2 = dns_get_edns_opt(rsp,len);
  if (pcVar2 == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(pcVar2 + 3) << 8 | *(ushort *)(pcVar2 + 3) >> 8;
  }
  return uVar1;
}

Assistant:

uint16_t dns_get_edns_udp_payload_size(const char * rsp, size_t len)
{
    const char * opt = dns_get_edns_opt(rsp, len);

    if (opt)
        return ntohs(*(uint16_t *)(opt 
                                   + 1                // NAME
                                   + sizeof(uint16_t) // OPT
                                  ));
    return 0;
}